

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O0

ON_Light * __thiscall ON_Light::Duplicate(ON_Light *this)

{
  int iVar1;
  undefined4 extraout_var;
  ON_Light *this_local;
  
  iVar1 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[2])();
  return (ON_Light *)CONCAT44(extraout_var,iVar1);
}

Assistant:

void ON_Light::Default()
{
  m_light_name.Destroy();
  m_bOn = true;
  m_intensity = 1.0;
  m_watts = 0.0;
  m_style =  ON::camera_directional_light;
  m_ambient = ON_Color(0,0,0);
  m_diffuse = ON_Color(255,255,255);
  m_specular = ON_Color(255,255,255);
  m_direction = ON_3dVector(0.0,0.0,-1.0);
  m_location = ON_3dPoint(0.0,0.0,0.0);
  m_length = ON_3dVector(0.0,0.0,0.0);
  m_width = ON_3dVector(0.0,0.0,0.0);
  m_spot_angle = 180.0;
  m_spot_exponent = 0.0;
  m_hotspot = 1.0;
  m_attenuation = ON_3dVector(1.0,0.0,0.0);
  m_shadow_intensity = 1.0;
  m_light_index = 0;
  memset(&m_light_id,0,sizeof(m_light_id));
}